

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O0

re2 * __thiscall re2::DeBruijnString_abi_cxx11_(re2 *this,int n)

{
  _Bit_pointer *this_00;
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  reference rVar4;
  reference local_530;
  LogMessage local_520;
  reference local_3a0;
  reference local_390;
  int local_37c;
  uint local_378;
  int i_2;
  int mask;
  int bits;
  int i_1;
  _Bit_type local_360;
  int local_358;
  allocator<bool> local_351;
  int i;
  vector<bool,_std::allocator<bool>_> did;
  LogMessage local_198;
  int local_14;
  re2 *prStack_10;
  int n_local;
  string *s;
  
  local_14 = n;
  prStack_10 = this;
  if (0x1f < n) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x8b);
    poVar3 = LogMessage::stream(&local_198);
    std::operator<<(poVar3,"Check failed: (n) < (static_cast<int>(8*sizeof(int)))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  if (local_14 < 1) {
    this_00 = &did.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0x8c);
    poVar3 = LogMessage::stream((LogMessage *)this_00);
    std::operator<<(poVar3,"Check failed: (n) > (0)");
    LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)
               &did.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
  }
  bVar1 = (byte)local_14 & 0x1f;
  std::allocator<bool>::allocator(&local_351);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&i,(long)(1 << bVar1),&local_351);
  std::allocator<bool>::~allocator(&local_351);
  for (local_358 = 0; local_358 < 1 << ((byte)local_14 & 0x1f); local_358 = local_358 + 1) {
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&i,(long)local_358);
    _i_1 = rVar4;
    std::_Bit_reference::operator=((_Bit_reference *)&i_1,false);
  }
  bits._3_1_ = 0;
  std::__cxx11::string::string((string *)this);
  mask = 0;
  while( true ) {
    if (local_14 + -1 <= mask) break;
    std::__cxx11::string::append((char *)this);
    mask = mask + 1;
  }
  i_2 = 0;
  local_378 = (1 << ((byte)local_14 & 0x1f)) - 1;
  for (local_37c = 0; local_37c < 1 << ((byte)local_14 & 0x1f); local_37c = local_37c + 1) {
    i_2 = i_2 * 2 & local_378;
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&i,(long)i_2 | 1);
    local_390 = rVar4;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_390);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::append((char *)this);
    }
    else {
      i_2 = i_2 | 1;
      std::__cxx11::string::append((char *)this);
    }
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&i,(long)i_2);
    local_3a0 = rVar4;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_3a0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_520,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xa0);
      poVar3 = LogMessage::stream(&local_520);
      std::operator<<(poVar3,"Check failed: !did[bits]");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_520);
    }
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&i,(long)i_2);
    local_530 = rVar4;
    std::_Bit_reference::operator=(&local_530,true);
  }
  bits._3_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i);
  return this;
}

Assistant:

static string DeBruijnString(int n) {
  CHECK_LT(n, static_cast<int>(8*sizeof(int)));
  CHECK_GT(n, 0);

  vector<bool> did(1<<n);
  for (int i = 0; i < 1<<n; i++)
    did[i] = false;

  string s;
  for (int i = 0; i < n-1; i++)
    s.append("0");
  int bits = 0;
  int mask = (1<<n) - 1;
  for (int i = 0; i < (1<<n); i++) {
    bits <<= 1;
    bits &= mask;
    if (!did[bits|1]) {
      bits |= 1;
      s.append("1");
    } else {
      s.append("0");
    }
    CHECK(!did[bits]);
    did[bits] = true;
  }
  return s;
}